

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonReader.h
# Opt level: O2

void __thiscall Json::JsonReader::JsonReader(JsonReader *this,ifstream *ifs)

{
  char cVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  JsonReader(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while( true ) {
      cVar1 = std::istream::get();
      if (cVar1 == -1) break;
      std::__cxx11::string::push_back((char)this);
    }
    this->__len = (int)(this->__JSON)._M_string_length;
  }
  return;
}

Assistant:

explicit JsonReader(std::ifstream &ifs) : JsonReader("") {
            if (ifs.is_open()) {
                char c;
                while ((c = ifs.get()) != EOF) __JSON += c;
                __len = __JSON.size();
            }
        }